

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::EagerPromiseNodeBase::EagerPromiseNodeBase
          (EagerPromiseNodeBase *this,Own<kj::_::PromiseNode> *dependencyParam,
          ExceptionOrValue *resultRef)

{
  PromiseNode *pPVar1;
  EventLoop *pEVar2;
  
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR___cxa_pure_virtual_00465b50;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_004657e8;
  pEVar2 = anon_unknown_54::currentEventLoop();
  (this->super_Event).loop = pEVar2;
  (this->super_Event).next = (Event *)0x0;
  (this->super_Event).prev = (Event **)0x0;
  (this->super_Event).firing = false;
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00465a90;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_00465ac8;
  (this->dependency).disposer = dependencyParam->disposer;
  (this->dependency).ptr = dependencyParam->ptr;
  dependencyParam->ptr = (PromiseNode *)0x0;
  (this->onReadyEvent).event = (Event *)0x0;
  this->resultRef = resultRef;
  pPVar1 = (this->dependency).ptr;
  (*pPVar1->_vptr_PromiseNode[1])(pPVar1,&this->dependency);
  pPVar1 = (this->dependency).ptr;
  (**pPVar1->_vptr_PromiseNode)(pPVar1,&this->super_Event);
  return;
}

Assistant:

EagerPromiseNodeBase::EagerPromiseNodeBase(
    Own<PromiseNode>&& dependencyParam, ExceptionOrValue& resultRef)
    : dependency(kj::mv(dependencyParam)), resultRef(resultRef) {
  dependency->setSelfPointer(&dependency);
  dependency->onReady(this);
}